

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_int,float>(Thread *this,UnopFunc<unsigned_int,_float> *f)

{
  Simd<float,_(unsigned_char)__x04_> val;
  SR result;
  float local_38 [4];
  Value local_28;
  
  local_38 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  std::transform<float*,unsigned_int*,unsigned_int(*)(float)>
            (local_38,(float *)&local_28.f32_,&local_28.i32_,f);
  Push(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}